

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

void __thiscall
rcg::Buffer::setNodemap(Buffer *this,shared_ptr<GenApi_3_4::CNodeMapRef> *_nodemap,string *tltype)

{
  shared_ptr<GenApi_3_4::CNodeMapRef> *this_00;
  bool bVar1;
  CChunkAdapterGEV *this_01;
  CChunkAdapterU3V *this_02;
  CChunkAdapterGeneric *this_03;
  __shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_00 = &this->nodemap;
  std::__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>,
             &_nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->chunkadapter).
              super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>);
  if ((this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    bVar1 = getBoolean(this_00,"ChunkModeActive",false,false);
    if (bVar1) {
      bVar1 = std::operator==(tltype,"GEV");
      if (bVar1) {
        this_01 = (CChunkAdapterGEV *)operator_new(0x18);
        GenApi_3_4::CChunkAdapterGEV::CChunkAdapterGEV
                  (this_01,(((this_00->
                             super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
                           _Ptr,-1);
        std::__shared_ptr<GenApi_3_4::CChunkAdapter,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<GenApi_3_4::CChunkAdapterGEV,void>
                  ((__shared_ptr<GenApi_3_4::CChunkAdapter,(__gnu_cxx::_Lock_policy)2> *)&local_30,
                   this_01);
      }
      else {
        bVar1 = std::operator==(tltype,"U3V");
        if (bVar1) {
          this_02 = (CChunkAdapterU3V *)operator_new(0x18);
          GenApi_3_4::CChunkAdapterU3V::CChunkAdapterU3V
                    (this_02,(((this_00->
                               super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
                             _Ptr,-1);
          std::__shared_ptr<GenApi_3_4::CChunkAdapter,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<GenApi_3_4::CChunkAdapterU3V,void>
                    ((__shared_ptr<GenApi_3_4::CChunkAdapter,(__gnu_cxx::_Lock_policy)2> *)&local_30
                     ,this_02);
        }
        else {
          this_03 = (CChunkAdapterGeneric *)operator_new(0x18);
          GenApi_3_4::CChunkAdapterGeneric::CChunkAdapterGeneric
                    (this_03,(((this_00->
                               super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
                             _Ptr,-1);
          std::__shared_ptr<GenApi_3_4::CChunkAdapter,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<GenApi_3_4::CChunkAdapterGeneric,void>
                    ((__shared_ptr<GenApi_3_4::CChunkAdapter,(__gnu_cxx::_Lock_policy)2> *)&local_30
                     ,this_03);
        }
      }
      std::__shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->chunkadapter).
                  super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>,
                 &local_30);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    }
  }
  return;
}

Assistant:

void Buffer::setNodemap(const std::shared_ptr<GenApi::CNodeMapRef> _nodemap, const std::string &tltype)
{
  nodemap=_nodemap;
  chunkadapter.reset();

  if (nodemap != 0)
  {
    if (getBoolean(nodemap, "ChunkModeActive", false))
    {
      if (tltype == "GEV")
      {
        chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterGEV(nodemap->_Ptr));
      }
      else if (tltype == "U3V")
      {
        chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterU3V(nodemap->_Ptr));
      }
      else
      {
        chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterGeneric(nodemap->_Ptr));
      }
    }
  }
}